

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O1

int av1_svc_get_min_ref_dist(AV1_COMP *cpi)

{
  AV1_PRIMARY *pAVar1;
  int iVar2;
  long lVar3;
  uint *puVar4;
  int iVar5;
  
  pAVar1 = cpi->ppi;
  puVar4 = &(cpi->common).current_frame.frame_number;
  if (pAVar1->use_svc != 0) {
    puVar4 = &(cpi->svc).current_superframe;
  }
  iVar2 = 0x7fffffff;
  lVar3 = -7;
  do {
    if ((pAVar1->rtc_ref).ref_idx[lVar3] != 0) {
      iVar5 = *puVar4 - (pAVar1->rtc_ref).buffer_time_index[(pAVar1->rtc_ref).refresh[lVar3]];
      if (iVar5 < iVar2) {
        iVar2 = iVar5;
      }
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0);
  return iVar2;
}

Assistant:

int av1_svc_get_min_ref_dist(const AV1_COMP *cpi) {
  RTC_REF *const rtc_ref = &cpi->ppi->rtc_ref;
  int min_dist = INT_MAX;
  const unsigned int current_frame_num =
      cpi->ppi->use_svc ? cpi->svc.current_superframe
                        : cpi->common.current_frame.frame_number;
  for (unsigned int i = 0; i < INTER_REFS_PER_FRAME; i++) {
    if (rtc_ref->reference[i]) {
      const int ref_frame_map_idx = rtc_ref->ref_idx[i];
      const int dist =
          current_frame_num - rtc_ref->buffer_time_index[ref_frame_map_idx];
      if (dist < min_dist) min_dist = dist;
    }
  }
  return min_dist;
}